

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O2

int32_t icu_63::PropNameData::getPropertyOrValueEnum(int32_t bytesTrieOffset,char *alias)

{
  UBool UVar1;
  int32_t iVar2;
  BytesTrie trie;
  
  trie.bytes_ = &bytesTries + bytesTrieOffset;
  trie.ownedArray_ = (uint8_t *)0x0;
  trie.remainingMatchLength_ = -1;
  trie.pos_ = trie.bytes_;
  UVar1 = containsName(&trie,alias);
  if (UVar1 == '\0') {
    iVar2 = -1;
  }
  else {
    iVar2 = BytesTrie::getValue(&trie);
  }
  BytesTrie::~BytesTrie(&trie);
  return iVar2;
}

Assistant:

int32_t PropNameData::getPropertyOrValueEnum(int32_t bytesTrieOffset, const char *alias) {
    BytesTrie trie(bytesTries+bytesTrieOffset);
    if(containsName(trie, alias)) {
        return trie.getValue();
    } else {
        return UCHAR_INVALID_CODE;
    }
}